

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  byte bVar1;
  int *__s;
  char *pIn;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  byte *z;
  sqlite3_vtab *psVar6;
  long lVar7;
  int iVar8;
  void *__dest;
  bool bVar9;
  int local_5c;
  sqlite3 *local_58;
  char *local_50;
  char *local_48;
  sqlite3_module *local_40;
  int local_34;
  
  local_40 = (sqlite3_module *)pAux;
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar3 = strlen((char *)__s);
    if (sVar3 != 4) goto LAB_001d9c6a;
    bVar9 = *__s == 0x706d6574;
  }
  else {
LAB_001d9c6a:
    bVar9 = false;
  }
  if ((argc != 5) && (bVar9 == false)) {
    psVar6 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar4;
    local_5c = 1;
    goto LAB_001d9eaf;
  }
  pcVar4 = argv[(ulong)bVar9 + 3];
  pIn = argv[(ulong)bVar9 + 4];
  local_48 = argv[(ulong)bVar9 * 2 + 1];
  local_58 = db;
  sVar3 = strlen(local_48);
  local_50 = pcVar4;
  sVar5 = strlen(pcVar4);
  local_34 = 0;
  z = (byte *)sqlite3Fts5Strndup(&local_34,pIn,-1);
  if (local_34 == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    lVar7 = 0;
    do {
      bVar1 = z[lVar7];
      if (bVar1 == "locking protocol"[lVar7 + 0xd]) {
        if ((ulong)bVar1 == 0) goto LAB_001d9d5c;
      }
      else if (""[bVar1] != ""[(byte)"locking protocol"[lVar7 + 0xd]]) {
        lVar7 = 0;
        goto LAB_001d9d6a;
      }
      lVar7 = lVar7 + 1;
    } while( true );
  }
  local_5c = local_34;
  iVar8 = 0;
  goto LAB_001d9df4;
LAB_001d9d6a:
  bVar1 = z[lVar7];
  if (bVar1 == "row"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d9d8e;
  }
  else if (""[bVar1] != ""[(byte)"row"[lVar7]]) {
    lVar7 = 0;
    goto LAB_001d9d9f;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001d9d6a;
LAB_001d9d9f:
  bVar1 = z[lVar7];
  if (bVar1 == "instance"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d9dc7;
  }
  else if (""[bVar1] != ""[(byte)"instance"[lVar7]]) {
    iVar8 = 0;
    pcVar4 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
    *pzErr = pcVar4;
    sqlite3_free(z);
    local_5c = 1;
    goto LAB_001d9df4;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001d9d9f;
LAB_001d9dc7:
  lVar7 = 2;
  goto LAB_001d9dcd;
LAB_001d9d8e:
  lVar7 = 1;
  goto LAB_001d9dcd;
LAB_001d9d5c:
  lVar7 = 0;
LAB_001d9dcd:
  sqlite3_free(z);
  iVar8 = (int)lVar7;
  local_5c = sqlite3_declare_vtab
                       (local_58,(char *)((long)&DAT_001e4fc0 + (long)(int)(&DAT_001e4fc0)[lVar7]));
LAB_001d9df4:
  psVar6 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_5c,(long)((int)sVar3 + (int)sVar5 + 0x42));
  if (psVar6 == (sqlite3_vtab *)0x0) {
    psVar6 = (sqlite3_vtab *)0x0;
  }
  else {
    sVar5 = (size_t)((int)sVar5 + 1);
    psVar6[2].pModule = local_40;
    psVar6[2].nRef = iVar8;
    psVar6[1].zErrMsg = (char *)local_58;
    psVar6[1].pModule = (sqlite3_module *)&psVar6[2].zErrMsg;
    __dest = (void *)((long)&psVar6[2].zErrMsg + sVar5);
    *(void **)&psVar6[1].nRef = __dest;
    memcpy(&psVar6[2].zErrMsg,local_50,sVar5);
    memcpy(__dest,local_48,(long)((int)sVar3 + 1));
    uVar2 = (byte)(psVar6[1].pModule)->iVersion - 0x22;
    if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)psVar6[1].pModule);
    }
    uVar2 = **(byte **)&psVar6[1].nRef - 0x22;
    if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)*(byte **)&psVar6[1].nRef);
    }
  }
LAB_001d9eaf:
  *ppVTab = psVar6;
  return local_5c;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = { 
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")", 
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1; 
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;
    
    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}